

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolMap.hpp
# Opt level: O2

void __thiscall PoolMap<String,_TestObject>::~PoolMap(PoolMap<String,_TestObject> *this)

{
  Item *pIVar1;
  ItemBlock *pIVar2;
  ItemBlock *pIVar3;
  Iterator *pIVar4;
  
  if (this->data != (Item **)0x0) {
    operator_delete__(this->data);
  }
  pIVar4 = &this->_begin;
  while (pIVar1 = pIVar4->item, pIVar1 != &this->endItem) {
    String::~String(&pIVar1->key);
    pIVar4 = (Iterator *)&pIVar1->next;
  }
  pIVar3 = this->blocks;
  while (pIVar3 != (ItemBlock *)0x0) {
    pIVar2 = pIVar3->next;
    operator_delete__(pIVar3);
    pIVar3 = pIVar2;
  }
  String::~String(&(this->endItem).key);
  return;
}

Assistant:

~PoolMap()
  {
    delete[] (char*)data;
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      i->~Item();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }